

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void AM_drawAuthorMarkers(void)

{
  ushort uVar1;
  uint uVar2;
  uint flip;
  uint uVar3;
  AActor *pAVar4;
  long lVar5;
  ulong uVar6;
  AActor **ppAVar7;
  AActor *pAVar8;
  uint uVar9;
  AActor *pAVar10;
  FTexture *tex;
  TThinkerIterator<AActor> it;
  FThinkerIterator FStack_48;
  
  TThinkerIterator<AActor>::TThinkerIterator
            ((TThinkerIterator<AActor> *)&FStack_48,"MapMarker",0x29);
LAB_0034a765:
  do {
    pAVar4 = (AActor *)FThinkerIterator::Next(&FStack_48,false);
    if (pAVar4 == (AActor *)0x0) {
      return;
    }
  } while (((pAVar4->flags2).Value & 0x10000000) != 0);
  lVar5 = (long)(pAVar4->picnum).texnum;
  if (lVar5 < 1) goto LAB_0034a7e7;
  tex = TexMan.Textures.Array[TexMan.Translation.Array[lVar5]].Texture;
  if (tex->Rotations != 0xffff) {
    uVar6 = (ulong)((uint)tex->Rotations * 0x50);
    uVar2 = *(uint *)((long)&(SpriteFrames.Array)->Texture[0].texnum + uVar6);
    uVar1 = *(ushort *)((long)((SpriteFrames.Array)->Texture + 0x10) + uVar6);
    goto joined_r0x0034a845;
  }
  flip = 0;
  goto LAB_0034a85a;
LAB_0034a7e7:
  if (pAVar4->frame < sprites.Array[pAVar4->sprite].numframes) {
    uVar6 = (ulong)((uint)pAVar4->frame * 0x50);
    uVar2 = *(uint *)((long)&(SpriteFrames.Array)->Texture[0].texnum +
                     uVar6 + (uint)sprites.Array[pAVar4->sprite].spriteframes * 0x50);
    uVar1 = *(ushort *)
             ((long)((SpriteFrames.Array)->Texture + 0x10) +
             uVar6 + (uint)sprites.Array[pAVar4->sprite].spriteframes * 0x50);
joined_r0x0034a845:
    flip = uVar1 & 1;
    if (uVar2 < TexMan.Textures.Count) {
      tex = TexMan.Textures.Array[(int)uVar2].Texture;
    }
    else {
      tex = (FTexture *)0x0;
    }
LAB_0034a85a:
    uVar2 = pAVar4->args[0];
    if (uVar2 == 0) {
      pAVar8 = pAVar4;
      pAVar10 = (AActor *)0x0;
LAB_0034a89f:
      uVar3 = uVar2;
      do {
        if (pAVar4->args[1] == 0) {
LAB_0034a8fc:
          DrawMarker(tex,(pAVar8->__Pos).X,(pAVar8->__Pos).Y,0,flip,(pAVar4->Scale).X,
                     (pAVar4->Scale).Y,pAVar4->Translation,pAVar4->Alpha,pAVar4->fillcolor,
                     pAVar4->RenderStyle);
          uVar3 = pAVar4->args[0];
        }
        else if (pAVar4->args[1] == 1) {
          if (hasglnodes == true) {
            uVar9 = pAVar8->subsector->flags & 2;
          }
          else {
            uVar9 = pAVar8->Sector->MoreFlags & 0x80;
          }
          if (uVar9 != 0) goto LAB_0034a8fc;
        }
        if ((uVar2 == 0) || (uVar3 == 0)) goto LAB_0034a765;
        ppAVar7 = &pAVar10->inext;
        if (pAVar10 == (AActor *)0x0) {
          ppAVar7 = (AActor **)((long)AActor::TIDHash + (ulong)((uVar2 & 0x7f) << 3));
        }
        pAVar8 = *ppAVar7;
        while( true ) {
          if (pAVar8 == (AActor *)0x0) goto LAB_0034a765;
          pAVar10 = pAVar8;
          if (pAVar8->tid == uVar2) break;
          pAVar8 = pAVar8->inext;
        }
      } while( true );
    }
    for (pAVar8 = AActor::TIDHash[uVar2 & 0x7f]; pAVar8 != (AActor *)0x0; pAVar8 = pAVar8->inext) {
      pAVar10 = pAVar8;
      if (pAVar8->tid == uVar2) goto LAB_0034a89f;
    }
  }
  goto LAB_0034a765;
}

Assistant:

void AM_drawAuthorMarkers ()
{
	// [RH] Draw any actors derived from AMapMarker on the automap.
	// If args[0] is 0, then the actor's sprite is drawn at its own location.
	// Otherwise, its sprite is drawn at the location of any actors whose TIDs match args[0].
	TThinkerIterator<AActor> it ("MapMarker", STAT_MAPMARKER);
	AActor *mark;

	while ((mark = it.Next()) != NULL)
	{
		if (mark->flags2 & MF2_DORMANT)
		{
			continue;
		}

		FTextureID picnum;
		FTexture *tex;
		WORD flip = 0;

		if (mark->picnum.isValid())
		{
			tex = TexMan(mark->picnum);
			if (tex->Rotations != 0xFFFF)
			{
				spriteframe_t *sprframe = &SpriteFrames[tex->Rotations];
				picnum = sprframe->Texture[0];
				flip = sprframe->Flip & 1;
				tex = TexMan[picnum];
			}
		}
		else
		{
			spritedef_t *sprdef = &sprites[mark->sprite];
			if (mark->frame >= sprdef->numframes)
			{
				continue;
			}
			else
			{
				spriteframe_t *sprframe = &SpriteFrames[sprdef->spriteframes + mark->frame];
				picnum = sprframe->Texture[0];
				flip = sprframe->Flip & 1;
				tex = TexMan[picnum];
			}
		}
		FActorIterator it (mark->args[0]);
		AActor *marked = mark->args[0] == 0 ? mark : it.Next();

		while (marked != NULL)
		{
			// Use more correct info if we have GL nodes available
			if (mark->args[1] == 0 ||
				(mark->args[1] == 1 && (hasglnodes ?
				 marked->subsector->flags & SSECF_DRAWN :
				 marked->Sector->MoreFlags & SECF_DRAWN)))
			{
				DrawMarker (tex, marked->X(), marked->Y(), 0, flip, mark->Scale.X, mark->Scale.Y, mark->Translation,
					mark->Alpha, mark->fillcolor, mark->RenderStyle);
			}
			marked = mark->args[0] != 0 ? it.Next() : NULL;
		}
	}
}